

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::AddLine(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImU32 col,float thickness)

{
  int *piVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  int iVar5;
  ImVec2 *pIVar6;
  ImGuiContext *pIVar7;
  ImVec2 *pIVar8;
  int iVar9;
  int iVar10;
  
  pIVar7 = GImGui;
  if (col < 0x1000000) {
    return;
  }
  IVar2 = *a;
  iVar5 = (this->_Path).Size;
  if (iVar5 == (this->_Path).Capacity) {
    if (iVar5 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar5 / 2 + iVar5;
    }
    iVar10 = iVar5 + 1;
    if (iVar5 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar6 = (ImVec2 *)(*(pIVar7->IO).MemAllocFn)((long)iVar10 << 3);
    pIVar8 = (this->_Path).Data;
    if (pIVar8 == (ImVec2 *)0x0) {
LAB_0013a9ce:
      pIVar8 = (ImVec2 *)0x0;
      pIVar7 = GImGui;
    }
    else {
      memcpy(pIVar6,pIVar8,(long)(this->_Path).Size << 3);
      pIVar7 = GImGui;
      pIVar8 = (this->_Path).Data;
      if (pIVar8 == (ImVec2 *)0x0) goto LAB_0013a9ce;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar7->IO).MemFreeFn)(pIVar8);
    (this->_Path).Data = pIVar6;
    (this->_Path).Capacity = iVar10;
    iVar5 = (this->_Path).Size;
  }
  else {
    pIVar6 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar5 + 1;
  IVar3.y = IVar2.y + 0.5;
  IVar3.x = IVar2.x + 0.5;
  pIVar6[iVar5] = IVar3;
  pIVar7 = GImGui;
  IVar2 = *b;
  iVar5 = (this->_Path).Size;
  if (iVar5 == (this->_Path).Capacity) {
    if (iVar5 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar5 / 2 + iVar5;
    }
    iVar10 = iVar5 + 1;
    if (iVar5 + 1 < iVar9) {
      iVar10 = iVar9;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar6 = (ImVec2 *)(*(pIVar7->IO).MemAllocFn)((long)iVar10 << 3);
    pIVar8 = (this->_Path).Data;
    if (pIVar8 == (ImVec2 *)0x0) {
LAB_0013aa8e:
      pIVar8 = (ImVec2 *)0x0;
      pIVar7 = GImGui;
    }
    else {
      memcpy(pIVar6,pIVar8,(long)(this->_Path).Size << 3);
      pIVar7 = GImGui;
      pIVar8 = (this->_Path).Data;
      if (pIVar8 == (ImVec2 *)0x0) goto LAB_0013aa8e;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar7->IO).MemFreeFn)(pIVar8);
    (this->_Path).Data = pIVar6;
    (this->_Path).Capacity = iVar10;
    iVar5 = (this->_Path).Size;
  }
  else {
    pIVar6 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar5 + 1;
  IVar4.y = IVar2.y + 0.5;
  IVar4.x = IVar2.x + 0.5;
  pIVar6[iVar5] = IVar4;
  AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,thickness,true);
  pIVar7 = GImGui;
  if (-1 < (this->_Path).Capacity) goto LAB_0013ab3c;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar8 = (ImVec2 *)(*(pIVar7->IO).MemAllocFn)(0);
  pIVar6 = (this->_Path).Data;
  if (pIVar6 == (ImVec2 *)0x0) {
LAB_0013ab29:
    pIVar6 = (ImVec2 *)0x0;
    pIVar7 = GImGui;
  }
  else {
    memcpy(pIVar8,pIVar6,(long)(this->_Path).Size << 3);
    pIVar7 = GImGui;
    pIVar6 = (this->_Path).Data;
    if (pIVar6 == (ImVec2 *)0x0) goto LAB_0013ab29;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar7->IO).MemFreeFn)(pIVar6);
  (this->_Path).Data = pIVar8;
  (this->_Path).Capacity = 0;
LAB_0013ab3c:
  (this->_Path).Size = 0;
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& a, const ImVec2& b, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;
    PathLineTo(a + ImVec2(0.5f,0.5f));
    PathLineTo(b + ImVec2(0.5f,0.5f));
    PathStroke(col, false, thickness);
}